

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O2

void __thiscall
hwtest::pgraph::MthdCelsiusPolygonOffsetFillEnable::adjust_orig_mthd
          (MthdCelsiusPolygonOffsetFillEnable *this)

{
  mt19937 *this_00;
  uint32_t *puVar1;
  result_type rVar2;
  
  this_00 = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test
             .rnd;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  if ((rVar2 & 1) != 0) {
    (this->super_SingleMthdTest).super_MthdTest.val =
         (uint)(ushort)(this->super_SingleMthdTest).super_MthdTest.val;
    rVar2 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    if ((rVar2 & 1) != 0) {
      puVar1 = &(this->super_SingleMthdTest).super_MthdTest.val;
      *puVar1 = *puVar1 & 0xf;
    }
    rVar2 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    if ((rVar2 & 1) != 0) {
      rVar2 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      puVar1 = &(this->super_SingleMthdTest).super_MthdTest.val;
      *puVar1 = *puVar1 | 1 << ((byte)rVar2 & 0x1f);
      rVar2 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      if ((rVar2 & 1) != 0) {
        rVar2 = std::
                mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                ::operator()(this_00);
        puVar1 = &(this->super_SingleMthdTest).super_MthdTest.val;
        *puVar1 = *puVar1 | 1 << ((byte)rVar2 & 0x1f);
      }
    }
  }
  adjust_orig_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig);
  return;
}

Assistant:

void adjust_orig_mthd() override {
		if (rnd() & 1) {
			val &= 0xffff;
			if (rnd() & 1) {
				val &= 0xf;
			}
			if (rnd() & 1) {
				val |= 1 << (rnd() & 0x1f);
				if (rnd() & 1) {
					val |= 1 << (rnd() & 0x1f);
				}
			}
		}
		adjust_orig_icmd(&orig);
	}